

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O0

int lj_sysprof_set_backtracer(luam_Sysprof_backtracer backtracer)

{
  int iVar1;
  luam_Sysprof_backtracer in_RDI;
  void *dummy;
  sysprof *sp;
  undefined8 local_20;
  sysprof *local_18;
  int local_4;
  
  local_18 = &sysprof;
  if (sysprof.state == 0) {
    sysprof.backtracer = in_RDI;
    if (in_RDI == (luam_Sysprof_backtracer)0x0) {
      sysprof.backtracer = default_backtrace_host;
      local_20 = 0;
      backtrace(&local_20,1);
    }
    iVar1 = is_unconfigured(local_18);
    if (iVar1 == 0) {
      local_18->state = 0;
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int lj_sysprof_set_backtracer(luam_Sysprof_backtracer backtracer) {
  struct sysprof *sp = &sysprof;

  if (sp->state != SPS_IDLE)
    return PROFILE_ERRUSE;
  if (backtracer == NULL) {
    sp->backtracer = default_backtrace_host;
    /*
    ** XXX: `backtrace` is not signal-safe, according to man,
    ** because it is lazy loaded on the first call, which triggers
    ** allocations. We need to call `backtrace` before starting profiling
    ** to avoid lazy loading.
    */
    void *dummy = NULL;
    backtrace(&dummy, 1);
  }
  else {
    sp->backtracer = backtracer;
  }
  if (!is_unconfigured(sp)) {
    sp->state = SPS_IDLE;
  }
  return PROFILE_SUCCESS;
}